

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<chaiscript::AST_Node>
          (unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_> *obj,
          bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  pointer ptr;
  undefined1 local_49;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_48;
  undefined8 local_40;
  shared_ptr<std::unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>_>
  local_38;
  Any local_28;
  pointer_____offset_0x10___ *local_20;
  undefined4 local_18;
  
  local_40 = *(undefined8 *)CONCAT71(in_register_00000031,t_return_value);
  local_28.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )&AST_Node::typeinfo;
  local_20 = &AST_Node::typeinfo;
  local_18 = 0;
  std::
  make_shared<std::unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>>,std::unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>>>
            ((unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_> *)
             &local_38);
  detail::Any::
  Any<std::shared_ptr<std::unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>>>,void>
            ((Any *)&local_48,&local_38);
  local_49 = 1;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,chaiscript::AST_Node*&,bool&>
            ((Type_Info *)obj,&local_28,(bool *)&local_48,(AST_Node **)&local_49,(bool *)&local_40);
  if (local_48._M_head_impl != (Data *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Data[1])();
  }
  local_48._M_head_impl = (Data *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<std::unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)obj;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::unique_ptr<T> &&obj, bool t_return_value) {
        auto ptr = obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(),
                                      chaiscript::detail::Any(std::make_shared<std::unique_ptr<T>>(std::move(obj))),
                                      true,
                                      ptr,
                                      t_return_value);
      }